

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

void __thiscall
booster::locale::impl_icu::date_format<wchar_t>::date_format
          (date_format<wchar_t> *this,DateFormat *fmt,string *codepage)

{
  pointer pcVar1;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  (this->super_formatter<wchar_t>).super_base_formatter._vptr_base_formatter =
       (_func_int **)&PTR__date_format_001d21d0;
  pcVar1 = (codepage->_M_dataplus)._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + codepage->_M_string_length);
  (this->cvt_).mode_ = cvt_skip;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  (this->aicu_fmt_)._M_t.
  super___uniq_ptr_impl<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>._M_t.
  super__Tuple_impl<0UL,_icu_70::DateFormat_*,_std::default_delete<icu_70::DateFormat>_>.
  super__Head_base<0UL,_icu_70::DateFormat_*,_false>._M_head_impl = (DateFormat *)0x0;
  this->icu_fmt_ = fmt;
  return;
}

Assistant:

date_format(icu::DateFormat *fmt,std::string codepage) :
                cvt_(codepage),
                icu_fmt_(fmt)
            {
            }